

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * monty_modsqrt(ModsqrtContext *sc,mp_int *x,uint *success)

{
  ulong uVar1;
  BignumInt *__dest;
  BignumInt *__dest_00;
  ulong uVar2;
  MontyContext *mc;
  uint which;
  mp_int *pmVar3;
  mp_int *r;
  ulong uVar4;
  BignumInt *__dest_01;
  ulong uVar5;
  BignumInt BVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  mp_int power_of_zk;
  mp_int tmp;
  mp_int xk;
  mp_int local_60;
  mp_int local_50;
  mp_int local_40;
  
  if (sc->zk == (mp_int *)0x0) {
    pmVar3 = monty_pow(sc->mc,sc->z,sc->k);
    sc->zk = pmVar3;
  }
  pmVar3 = mp_make_sized(sc->mc->rw * 3);
  uVar4 = pmVar3->nw;
  __dest_00 = pmVar3->w;
  r = monty_pow(sc->mc,x,sc->km1o2);
  uVar2 = sc->mc->rw;
  if (uVar2 <= uVar4) {
    if (uVar4 - uVar2 < uVar4) {
      uVar4 = uVar4 - uVar2;
    }
    uVar8 = r->nw;
    if (uVar2 < r->nw) {
      uVar8 = uVar2;
    }
    local_40.nw = uVar2;
    local_40.w = __dest_00;
    memmove(__dest_00,r->w,uVar8 * 8);
    smemclr(__dest_00 + uVar8,(uVar2 - uVar8) * 8);
    monty_mul_into(sc->mc,r,r,x);
    monty_mul_into(sc->mc,&local_40,r,&local_40);
    uVar8 = sc->mc->rw;
    if ((uVar8 <= uVar4) &&
       (__dest_01 = __dest_00 + uVar2, local_50.nw = uVar8, local_50.w = __dest_01,
       uVar8 <= uVar4 - uVar8)) {
      __dest = __dest_01 + uVar8;
      uVar4 = sc->zk->nw;
      if (uVar8 < uVar4) {
        uVar4 = uVar8;
      }
      local_60.nw = uVar8;
      local_60.w = __dest;
      memmove(__dest,sc->zk->w,uVar4 * 8);
      smemclr(__dest + uVar4,(uVar8 - uVar4) * 8);
      if (sc->e != 0) {
        uVar4 = uVar2;
        if (uVar8 < uVar2) {
          uVar4 = uVar8;
        }
        uVar5 = 0;
        do {
          memmove(__dest_01,__dest_00,uVar4 * 8);
          smemclr(__dest_01 + uVar4,(uVar8 - uVar4) * 8);
          uVar1 = uVar5 + 1;
          uVar9 = uVar1;
          if (uVar1 < sc->e) {
            do {
              monty_mul_into(sc->mc,&local_50,&local_50,&local_50);
              uVar9 = uVar9 + 1;
            } while (uVar9 < sc->e);
          }
          mc = sc->mc;
          which = mp_cmp_eq(&local_50,mc->powers_of_r_mod_m[0]);
          if (uVar5 == 0) {
            uVar5 = x->nw;
            uVar9 = 0;
            uVar7 = 0;
            do {
              if (uVar7 < uVar5) {
                BVar6 = x->w[uVar7];
              }
              else {
                BVar6 = 0;
              }
              uVar9 = uVar9 | BVar6;
              uVar7 = uVar7 + 1;
            } while (uVar5 + (uVar5 == 0) != uVar7);
            *success = which | ((uVar9 & 1) == 0 && uVar9 >> 1 == 0);
          }
          else {
            monty_mul_into(mc,&local_50,r,&local_60);
            mp_select_into(r,&local_50,r,which);
            monty_mul_into(sc->mc,&local_60,&local_60,&local_60);
            monty_mul_into(sc->mc,&local_50,&local_40,&local_60);
            if (uVar2 != 0) {
              uVar5 = 0;
              do {
                if (uVar5 < uVar8) {
                  BVar6 = __dest_01[uVar5];
                }
                else {
                  BVar6 = 0;
                }
                __dest_00[uVar5] = (__dest_00[uVar5] ^ BVar6) & -(ulong)which ^ BVar6;
                uVar5 = uVar5 + 1;
              } while (uVar2 != uVar5);
            }
          }
          uVar5 = uVar1;
        } while (uVar1 < sc->e);
      }
      mp_free(pmVar3);
      return r;
    }
  }
  __assert_fail("len <= pool->nw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                699,"mp_int mp_alloc_from_scratch(mp_int *, size_t)");
}

Assistant:

mp_int *monty_modsqrt(ModsqrtContext *sc, mp_int *x, unsigned *success)
{
    modsqrt_lazy_setup(sc);

    mp_int *scratch_to_free = mp_make_sized(3 * sc->mc->rw);
    mp_int scratch = *scratch_to_free;

    /*
     * Compute toret = x^{(k+1)/2}, our starting point for the output
     * square root, and also xk = x^k which we'll use as we go along
     * for knowing when to apply correction factors. We do this by
     * first computing x^{(k-1)/2}, then multiplying it by x, then
     * multiplying the two together.
     */
    mp_int *toret = monty_pow(sc->mc, x, sc->km1o2);
    mp_int xk = mp_alloc_from_scratch(&scratch, sc->mc->rw);
    mp_copy_into(&xk, toret);
    monty_mul_into(sc->mc, toret, toret, x);
    monty_mul_into(sc->mc, &xk, toret, &xk);

    mp_int tmp = mp_alloc_from_scratch(&scratch, sc->mc->rw);

    mp_int power_of_zk = mp_alloc_from_scratch(&scratch, sc->mc->rw);
    mp_copy_into(&power_of_zk, sc->zk);

    for (size_t i = 0; i < sc->e; i++) {
        mp_copy_into(&tmp, &xk);
        for (size_t j = i+1; j < sc->e; j++)
            monty_mul_into(sc->mc, &tmp, &tmp, &tmp);
        unsigned eq1 = mp_cmp_eq(&tmp, monty_identity(sc->mc));

        if (i == 0) {
            /* One special case: if x=0, then no power of x will ever
             * equal 1, but we should still report success on the
             * grounds that 0 does have a square root mod p. */
            *success = eq1 | mp_eq_integer(x, 0);
        } else {
            monty_mul_into(sc->mc, &tmp, toret, &power_of_zk);
            mp_select_into(toret, &tmp, toret, eq1);

            monty_mul_into(sc->mc, &power_of_zk,
                           &power_of_zk, &power_of_zk);

            monty_mul_into(sc->mc, &tmp, &xk, &power_of_zk);
            mp_select_into(&xk, &tmp, &xk, eq1);
        }
    }

    mp_free(scratch_to_free);

    return toret;
}